

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O1

Aig_Man_t * Rtm_ManToAig(Rtm_Man_t *pRtm)

{
  int iVar1;
  int iVar2;
  void **ppvVar3;
  void *pvVar4;
  undefined8 *puVar5;
  int *pLatches;
  Aig_Man_t *p;
  Aig_Obj_t *pAVar6;
  Vec_Ptr_t *pVVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  int nRegs;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  int local_58;
  
  pVVar7 = pRtm->vObjs;
  iVar10 = pVVar7->nSize;
  lVar14 = (long)iVar10;
  pLatches = (int *)malloc(lVar14 * 8);
  if (lVar14 < 1) {
    nRegs = 0;
  }
  else {
    ppvVar3 = pVVar7->pArray;
    lVar8 = 0;
    nRegs = 0;
    do {
      pvVar4 = ppvVar3[lVar8];
      uVar11 = *(uint *)((long)pvVar4 + 8) >> 7 & 0xff;
      if (uVar11 != 0) {
        iVar1 = pRtm->vPis->nSize;
        iVar2 = *(int *)((long)pvVar4 + 0xc);
        uVar12 = 0;
        do {
          *(int *)((long)pLatches + uVar12 + (long)iVar2 * 8) = iVar1 + nRegs;
          nRegs = (*(uint *)((long)pvVar4 + uVar12 * 4 + 0x20) & 0xfff) + nRegs;
          uVar12 = uVar12 + 4;
        } while (uVar11 << 2 != uVar12);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != lVar14);
  }
  p = Aig_ManStart(iVar10 + nRegs);
  if (pRtm->vObjs->nSize < 1) {
LAB_0060e3df:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  *(Aig_Obj_t **)*pRtm->vObjs->pArray = p->pConst1;
  pVVar7 = pRtm->vPis;
  if (0 < pVVar7->nSize) {
    lVar14 = 0;
    do {
      puVar5 = (undefined8 *)pVVar7->pArray[lVar14];
      pAVar6 = Aig_ObjCreateCi(p);
      *puVar5 = pAVar6;
      lVar14 = lVar14 + 1;
      pVVar7 = pRtm->vPis;
    } while (lVar14 < pVVar7->nSize);
  }
  iVar10 = nRegs;
  if (0 < nRegs) {
    do {
      Aig_ObjCreateCi(p);
      iVar10 = iVar10 + -1;
    } while (iVar10 != 0);
  }
  pVVar7 = pRtm->vObjs;
  if (0 < pVVar7->nSize) {
    lVar14 = 0;
    do {
      Rtm_ManToAig_rec(p,pRtm,(Rtm_Obj_t *)pVVar7->pArray[lVar14],pLatches);
      lVar14 = lVar14 + 1;
      pVVar7 = pRtm->vObjs;
    } while (lVar14 < pVVar7->nSize);
  }
  pVVar7 = pRtm->vPos;
  if (0 < pVVar7->nSize) {
    lVar14 = 0;
    do {
      Aig_ObjCreateCo(p,*pVVar7->pArray[lVar14]);
      lVar14 = lVar14 + 1;
      pVVar7 = pRtm->vPos;
    } while (lVar14 < pVVar7->nSize);
  }
  pVVar7 = pRtm->vObjs;
  if (0 < pVVar7->nSize) {
    lVar14 = 0;
    do {
      pvVar4 = pVVar7->pArray[lVar14];
      if ((*(ushort *)((long)pvVar4 + 8) & 0x7f80) != 0) {
        uVar12 = 0;
        do {
          if ((*(ushort *)((long)pvVar4 + uVar12 * 0x10 + 0x20) & 0xfff) != 0) {
            uVar11 = *(uint *)((long)pvVar4 + uVar12 * 0x10 + 0x20);
            uVar9 = uVar11 & 0xfff;
            if (uVar9 != 0) {
              uVar16 = **(ulong **)((long)pvVar4 + uVar12 * 0x10 + 0x18);
              uVar13 = 0;
              iVar10 = -1;
              local_58 = (int)uVar12;
              do {
                uVar11 = uVar11 >> 0xc;
                if (10 < uVar9) {
                  uVar11 = pRtm->pExtra[(ulong)uVar11 + (long)((int)(uVar9 + iVar10) >> 4)];
                }
                uVar11 = uVar11 >> ((char)(uVar9 + iVar10) * '\x02' & 0x1fU) & 3;
                if (2 < uVar11 - 1) {
                  __assert_fail("Val == RTM_VAL_ZERO || Val == RTM_VAL_ONE || Val == RTM_VAL_VOID",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigRet.c"
                                ,0x326,"Aig_Man_t *Rtm_ManToAig(Rtm_Man_t *)");
                }
                uVar15 = (ulong)(uVar11 == 2);
                Aig_ObjCreateCo(p,(Aig_Obj_t *)(uVar16 ^ uVar15));
                uVar11 = pLatches[(long)local_58 + (long)*(int *)((long)pvVar4 + 0xc) * 2] + uVar13;
                if (((int)uVar11 < 0) || (p->vCis->nSize <= (int)uVar11)) goto LAB_0060e3df;
                uVar16 = uVar15 ^ (ulong)p->vCis->pArray[uVar11];
                uVar13 = uVar13 + 1;
                uVar11 = *(uint *)((long)pvVar4 + uVar12 * 0x10 + 0x20);
                uVar9 = uVar11 & 0xfff;
                iVar10 = iVar10 + -1;
              } while (uVar13 < uVar9);
            }
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 < (*(uint *)((long)pvVar4 + 8) >> 7 & 0xff));
      }
      lVar14 = lVar14 + 1;
      pVVar7 = pRtm->vObjs;
    } while (lVar14 < pVVar7->nSize);
  }
  if (pLatches != (int *)0x0) {
    free(pLatches);
  }
  Aig_ManSetRegNum(p,nRegs);
  Aig_ManCleanup(p);
  iVar10 = Aig_ManCheck(p);
  if (iVar10 == 0) {
    puts("Rtm_ManToAig: The network check has failed.");
  }
  return p;
}

Assistant:

Aig_Man_t * Rtm_ManToAig( Rtm_Man_t * pRtm )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObjNew;
    Rtm_Obj_t * pObjRtm;
    Rtm_Edg_t * pEdge;
    int i, k, m, Val, nLatches, * pLatches;
    // count latches and mark the first latch on each edge
    pLatches = ABC_ALLOC( int, 2 * Vec_PtrSize(pRtm->vObjs) );
    nLatches = 0;
    Rtm_ManForEachObj( pRtm, pObjRtm, i )
    Rtm_ObjForEachFaninEdge( pObjRtm, pEdge, k )
    {
        pLatches[2*pObjRtm->Id + k] = Vec_PtrSize(pRtm->vPis) + nLatches;
        nLatches += pEdge->nLats;
    }
    // create the new manager
    pNew = Aig_ManStart( Vec_PtrSize(pRtm->vObjs) + nLatches );
    // create PIs/POs and latches
    pObjRtm = (Rtm_Obj_t *)Vec_PtrEntry( pRtm->vObjs, 0 );
    pObjRtm->pCopy = Aig_ManConst1(pNew);
    Rtm_ManForEachPi( pRtm, pObjRtm, i )
        pObjRtm->pCopy = Aig_ObjCreateCi(pNew);
    for ( i = 0; i < nLatches; i++ )
        Aig_ObjCreateCi(pNew);
    // create internal nodes
    Rtm_ManForEachObj( pRtm, pObjRtm, i )
        Rtm_ManToAig_rec( pNew, pRtm, pObjRtm, pLatches );
    // create POs
    Rtm_ManForEachPo( pRtm, pObjRtm, i )
        Aig_ObjCreateCo( pNew, (Aig_Obj_t *)pObjRtm->pCopy );
    // connect latches 
    Rtm_ManForEachObj( pRtm, pObjRtm, i )
    Rtm_ObjForEachFaninEdge( pObjRtm, pEdge, k )
    {
        if ( pEdge->nLats == 0 )
            continue;
        pObjNew = (Aig_Obj_t *)Rtm_ObjFanin( pObjRtm, k )->pCopy;
        for ( m = 0; m < (int)pEdge->nLats; m++ )
        {
            Val = Rtm_ObjGetOne( pRtm, pEdge, pEdge->nLats - 1 - m );
            assert( Val == RTM_VAL_ZERO || Val == RTM_VAL_ONE || Val == RTM_VAL_VOID );
            pObjNew = Aig_NotCond( pObjNew, Val == RTM_VAL_ONE );
            Aig_ObjCreateCo( pNew, pObjNew );
            pObjNew = Aig_ManCi( pNew, pLatches[2*pObjRtm->Id + k] + m );
            pObjNew = Aig_NotCond( pObjNew, Val == RTM_VAL_ONE );
        }
//        assert( Aig_Regular(pObjNew)->nRefs > 0 );
    }
    ABC_FREE( pLatches );
    Aig_ManSetRegNum( pNew, nLatches );
    // remove useless nodes
    Aig_ManCleanup( pNew );
    if ( !Aig_ManCheck( pNew ) )
        printf( "Rtm_ManToAig: The network check has failed.\n" );
    return pNew;
}